

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O1

void __thiscall
duckdb::AnyTypeInfo::AnyTypeInfo(AnyTypeInfo *this,LogicalType *target_type_p,idx_t cast_score_p)

{
  (this->super_ExtraTypeInfo).type = ANY_TYPE_INFO;
  (this->super_ExtraTypeInfo).alias._M_dataplus._M_p =
       (pointer)&(this->super_ExtraTypeInfo).alias.field_2;
  (this->super_ExtraTypeInfo).alias._M_string_length = 0;
  (this->super_ExtraTypeInfo).alias.field_2._M_local_buf[0] = '\0';
  (this->super_ExtraTypeInfo).extension_info.
  super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
  .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl = (ExtensionTypeInfo *)0x0
  ;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo = (_func_int **)&PTR__AnyTypeInfo_019a79e8;
  LogicalType::LogicalType(&this->target_type,target_type_p);
  this->cast_score = cast_score_p;
  return;
}

Assistant:

AnyTypeInfo::AnyTypeInfo(LogicalType target_type_p, idx_t cast_score_p)
    : ExtraTypeInfo(ExtraTypeInfoType::ANY_TYPE_INFO), target_type(std::move(target_type_p)), cast_score(cast_score_p) {
}